

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O3

void SkipExpectedString(FILE *in,char *str)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  SchemeObject *pSVar4;
  FILE *__stream;
  undefined8 uVar5;
  size_t __size;
  FILE *__s;
  char *pcVar6;
  
  if (*str != '\0') {
    pcVar6 = str + 1;
    do {
      uVar3 = getc((FILE *)in);
      if (uVar3 != (int)pcVar6[-1]) {
        __stream = (FILE *)(ulong)uVar3;
        SkipExpectedString_cold_1();
        uVar3 = getc(__stream);
        ungetc(uVar3,__stream);
        __s = (FILE *)(ulong)uVar3;
        cVar2 = IsDelimiter(uVar3);
        if (cVar2 != '\0') {
          return;
        }
        PeekExpectedDelimiter_cold_1();
        switch(*(SchemeObjectType *)&__stream->field_0x4) {
        case BOOLEAN:
          cVar2 = IsFalse((SchemeObject *)__stream);
          uVar5 = 0x66;
          if (cVar2 == '\0') {
            uVar5 = 0x74;
          }
          fprintf(__s,"#%c",uVar5);
          return;
        case FIXNUM:
          fprintf(__s,"%ld",
                  (((anon_union_24_11_934e1188_for_data *)&__stream->_IO_read_ptr)->pair).car);
          return;
        case FLOATNUM:
          fprintf(__s,"%lf",
                  (((anon_union_24_11_934e1188_for_data *)&__stream->_IO_read_ptr)->pair).car);
          return;
        case CHARACTER:
          cVar2 = (((anon_union_24_11_934e1188_for_data *)&__stream->_IO_read_ptr)->boolean).value;
          fwrite("#\\",2,1,__s);
          if (cVar2 == ' ') {
            pcVar6 = "space";
            __size = 5;
          }
          else {
            if (cVar2 != '\n') {
              putc((int)cVar2,__s);
              return;
            }
            pcVar6 = "newline";
            __size = 7;
          }
          break;
        case STRING:
          pSVar4 = (((anon_union_24_11_934e1188_for_data *)&__stream->_IO_read_ptr)->pair).car;
          putchar(0x22);
          goto LAB_001020cc;
        case THE_EMPTY_LIST:
          pcVar6 = "()";
          __size = 2;
          break;
        case PAIR:
          fputc(0x28,__s);
          WritePair((FILE *)__s,(SchemeObject *)__stream);
          fputc(0x29,__s);
          return;
        case SYMBOL:
          fputs((char *)(((anon_union_24_11_934e1188_for_data *)&__stream->_IO_read_ptr)->pair).car,
                __s);
          return;
        case PRIMITIVE_PROCEDURE:
          fwrite("#<primitive-procedure>",0x16,1,__s);
        case COMPOUND_PROCEDURE:
          pcVar6 = "#<compound-procedure>";
          __size = 0x15;
          break;
        case INPUT_PORT:
          pcVar6 = "#<input-port>";
          __size = 0xd;
          break;
        case OUT_PORT:
          pcVar6 = "#<output-port>";
          __size = 0xe;
          break;
        case EOF_OBJECT:
          pcVar6 = "#<eof>";
          __size = 6;
          break;
        default:
          Writer_cold_1();
          while( true ) {
            pSVar4 = Car((SchemeObject *)__stream);
            __stream = (FILE *)Cdr((SchemeObject *)__stream);
            Writer((FILE *)__s,pSVar4);
            if (*(SchemeObjectType *)&__stream->field_0x4 != PAIR) break;
            fputc(0x20,__s);
          }
          if (*(SchemeObjectType *)&__stream->field_0x4 != THE_EMPTY_LIST) {
            fwrite(" . ",3,1,__s);
            Writer((FILE *)__s,(SchemeObject *)__stream);
            return;
          }
          return;
        }
        fwrite(pcVar6,__size,1,__s);
        return;
      }
      cVar2 = *pcVar6;
      pcVar6 = pcVar6 + 1;
    } while (cVar2 != '\0');
  }
  return;
LAB_001020cc:
  bVar1 = (byte)pSVar4->ref_count;
  if (bVar1 < 0x22) {
    if (bVar1 == 10) {
      pcVar6 = "\\n";
      goto LAB_00102110;
    }
    if (bVar1 == 0) {
      putchar(0x22);
      return;
    }
LAB_0010211e:
    putc((int)(char)bVar1,__s);
  }
  else {
    if (bVar1 == 0x22) {
      pcVar6 = "\\\"";
    }
    else {
      if (bVar1 != 0x5c) goto LAB_0010211e;
      pcVar6 = "\\\\";
    }
LAB_00102110:
    fwrite(pcVar6,2,1,__s);
  }
  pSVar4 = (SchemeObject *)((long)&pSVar4->ref_count + 1);
  goto LAB_001020cc;
}

Assistant:

static void
SkipExpectedString(FILE* in, char* str)
{
    int c;
    while (*str != '\0') {
        c = getc(in);
        if (c != *str) {
            fprintf(stderr, "unexpected character '%c'\n", c);
            exit(1);
        }
        str++;
    }
}